

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve2right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *b,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *rhs)

{
  int *piVar1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  pointer pnVar5;
  int *piVar6;
  pointer pnVar7;
  Real val;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  undefined1 auVar8 [56];
  int iVar9;
  ulong uVar10;
  undefined4 in_stack_fffffffffffffdd4;
  undefined8 uVar11;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs2;
  int *ridx;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  int f;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_188;
  undefined1 local_178 [8];
  uint auStack_170 [2];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  uint auStack_140 [2];
  int local_138;
  undefined1 local_134;
  fpclass_type local_130;
  int32_t local_12c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  undefined1 local_d8 [8];
  uint auStack_d0 [2];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t local_8c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  uVar10 = (ulong)(uint)(rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  rhs2 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)(rhs->super_IdxSet).idx;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_188,
             &(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon(local_188._M_ptr);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val,(type *)0x0);
  this_00 = &this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(y);
  this->usetup = true;
  uVar11 = 0x30d5e6;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    iVar9 = (this->ssvec).super_IdxSet.num;
    local_88.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_88.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_88.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[0xe];
    local_88.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[0xf];
    local_88.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_88.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_88.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_88.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_88.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_88.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_88.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_88.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_88.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_88.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_88.m_backend.exp = epsilon.m_backend.exp;
    local_88.m_backend.neg = epsilon.m_backend.neg;
    local_88.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_88.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar1 = (x->super_IdxSet).idx;
    pnVar2 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar3 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a8[0] = epsilon.m_backend.data._M_elems[0xc];
    local_a8[1] = epsilon.m_backend.data._M_elems[0xd];
    auStack_a0[0] = epsilon.m_backend.data._M_elems[0xe];
    auStack_a0[1] = epsilon.m_backend.data._M_elems[0xf];
    local_b8[0] = epsilon.m_backend.data._M_elems[8];
    local_b8[1] = epsilon.m_backend.data._M_elems[9];
    auStack_b0[0] = epsilon.m_backend.data._M_elems[10];
    auStack_b0[1] = epsilon.m_backend.data._M_elems[0xb];
    local_c8[0] = epsilon.m_backend.data._M_elems[4];
    local_c8[1] = epsilon.m_backend.data._M_elems[5];
    auStack_c0[0] = epsilon.m_backend.data._M_elems[6];
    auStack_c0[1] = epsilon.m_backend.data._M_elems[7];
    auStack_d0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_d0[1] = epsilon.m_backend.data._M_elems[3];
    local_98 = epsilon.m_backend.exp;
    local_94 = epsilon.m_backend.neg;
    local_90 = epsilon.m_backend.fpclass;
    local_8c = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    auVar8 = ZEXT3256(CONCAT428(in_stack_fffffffffffffdd4,
                                CONCAT424((int)uVar10,
                                          CONCAT816(rhs2,CONCAT88((rhs->
                                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,local_d8
                                                  )))));
    eps2_00.m_backend.data._M_elems[0xe] = (int)uVar11;
    eps2_00.m_backend.data._M_elems[0xf] = (int)((ulong)uVar11 >> 0x20);
    eps2_00.m_backend.data._M_elems[0] = auVar8._0_4_;
    eps2_00.m_backend.data._M_elems[1] = auVar8._4_4_;
    eps2_00.m_backend.data._M_elems[2] = auVar8._8_4_;
    eps2_00.m_backend.data._M_elems[3] = auVar8._12_4_;
    eps2_00.m_backend.data._M_elems[4] = auVar8._16_4_;
    eps2_00.m_backend.data._M_elems[5] = auVar8._20_4_;
    eps2_00.m_backend.data._M_elems[6] = auVar8._24_4_;
    eps2_00.m_backend.data._M_elems[7] = auVar8._28_4_;
    eps2_00.m_backend.data._M_elems[8] = auVar8._32_4_;
    eps2_00.m_backend.data._M_elems[9] = auVar8._36_4_;
    eps2_00.m_backend.data._M_elems[10] = auVar8._40_4_;
    eps2_00.m_backend.data._M_elems[0xb] = auVar8._44_4_;
    eps2_00.m_backend.data._M_elems[0xc] = auVar8._48_4_;
    eps2_00.m_backend.data._M_elems[0xd] = auVar8._52_4_;
    eps2_00.m_backend._64_8_ = this_00;
    eps2_00.m_backend.fpclass = (int)uVar10;
    eps2_00.m_backend.prec_elem = (int)(uVar10 >> 0x20);
    iVar9 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::vSolveRight4update2
                      (this_00,&local_88,pnVar2,piVar1,pnVar3,ridx,iVar9,pnVar4,eps2_00,rhs2,ridx,
                       epsilon.m_backend.data._M_elems[0],
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)epsilon.m_backend.data._M_elems._8_8_,
                       (int *)epsilon.m_backend.data._M_elems._16_8_,
                       (int *)epsilon.m_backend.data._M_elems._24_8_);
    (x->super_IdxSet).num = iVar9;
    x->setupStatus = false;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    uVar11 = 0x30d5ff;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    iVar9 = (this->ssvec).super_IdxSet.num;
    local_128.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_128.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_128.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[0xe];
    local_128.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[0xf];
    local_128.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_128.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_128.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_128.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_128.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_128.m_backend.exp = epsilon.m_backend.exp;
    local_128.m_backend.neg = epsilon.m_backend.neg;
    local_128.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_128.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar1 = (x->super_IdxSet).idx;
    pnVar2 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar3 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_148[0] = epsilon.m_backend.data._M_elems[0xc];
    local_148[1] = epsilon.m_backend.data._M_elems[0xd];
    auStack_140[0] = epsilon.m_backend.data._M_elems[0xe];
    auStack_140[1] = epsilon.m_backend.data._M_elems[0xf];
    local_158[0] = epsilon.m_backend.data._M_elems[8];
    local_158[1] = epsilon.m_backend.data._M_elems[9];
    auStack_150[0] = epsilon.m_backend.data._M_elems[10];
    auStack_150[1] = epsilon.m_backend.data._M_elems[0xb];
    local_168[0] = epsilon.m_backend.data._M_elems[4];
    local_168[1] = epsilon.m_backend.data._M_elems[5];
    auStack_160[0] = epsilon.m_backend.data._M_elems[6];
    auStack_160[1] = epsilon.m_backend.data._M_elems[7];
    auStack_170[0] = epsilon.m_backend.data._M_elems[2];
    auStack_170[1] = epsilon.m_backend.data._M_elems[3];
    local_138 = epsilon.m_backend.exp;
    local_134 = epsilon.m_backend.neg;
    local_130 = epsilon.m_backend.fpclass;
    local_12c = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar5 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->forest).super_IdxSet.idx;
    pnVar7 = (this->forest).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar5;
    eps2.m_backend.data._M_elems._0_8_ = local_178;
    eps2.m_backend.data._M_elems._16_8_ = rhs2;
    eps2.m_backend.data._M_elems[6] = (int)uVar10;
    eps2.m_backend.data._M_elems[7] = (int)(uVar10 >> 0x20);
    eps2.m_backend.data._M_elems._32_8_ = pnVar7;
    eps2.m_backend.data._M_elems._40_8_ = &f;
    eps2.m_backend.data._M_elems._48_8_ = piVar6;
    eps2.m_backend.data._M_elems[0xe] = (int)uVar11;
    eps2.m_backend.data._M_elems[0xf] = (int)((ulong)uVar11 >> 0x20);
    eps2.m_backend._64_8_ = this_00;
    eps2.m_backend.fpclass = (int)uVar10;
    eps2.m_backend.prec_elem = (int)(uVar10 >> 0x20);
    iVar9 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::vSolveRight4update2
                      (this_00,&local_128,pnVar2,piVar1,pnVar3,ridx,iVar9,pnVar4,eps2,rhs2,ridx,
                       epsilon.m_backend.data._M_elems[0],
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)epsilon.m_backend.data._M_elems._8_8_,
                       (int *)epsilon.m_backend.data._M_elems._16_8_,
                       (int *)epsilon.m_backend.data._M_elems._24_8_);
    (x->super_IdxSet).num = iVar9;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve2right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update2(epsilon, x.altValues(), x.altIndexMem(),
                                    ssvec.get_ptr(), sidx, n, y.get_ptr(),
                                    epsilon, rhs.altValues(), ridx, rsize, nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update2(epsilon, x.altValues(), x.altIndexMem(),
                                    ssvec.get_ptr(), sidx, n, y.get_ptr(),
                                    epsilon, rhs.altValues(), ridx, rsize,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}